

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

void __thiscall S2Polygon::InitLoops(S2Polygon *this,LoopMap *loop_map)

{
  initializer_list<S2Loop_*> __l;
  bool bVar1;
  reference ppSVar2;
  size_type sVar3;
  const_reference ppSVar4;
  ostream *poVar5;
  S2LogMessage local_120;
  S2LogMessageVoidify local_109;
  S2Loop *local_108;
  S2Loop *child;
  mapped_type *pmStack_f8;
  int i;
  vector<S2Loop_*,_std::allocator<S2Loop_*>_> *children;
  S2Loop *loop;
  int depth;
  allocator<S2Loop_*> local_d1;
  S2Loop *local_d0;
  iterator local_c8;
  size_type local_c0;
  deque<S2Loop_*,_std::allocator<S2Loop_*>_> local_b8;
  undefined1 local_68 [8];
  stack<S2Loop_*,_std::deque<S2Loop_*,_std::allocator<S2Loop_*>_>_> loop_stack;
  LoopMap *loop_map_local;
  S2Polygon *this_local;
  
  local_d0 = (S2Loop *)0x0;
  local_c8 = &local_d0;
  local_c0 = 1;
  loop_stack.c.super__Deque_base<S2Loop_*,_std::allocator<S2Loop_*>_>._M_impl.super__Deque_impl_data
  ._M_finish._M_node = (_Map_pointer)loop_map;
  std::allocator<S2Loop_*>::allocator(&local_d1);
  __l._M_len = local_c0;
  __l._M_array = local_c8;
  std::deque<S2Loop_*,_std::allocator<S2Loop_*>_>::deque(&local_b8,__l,&local_d1);
  std::stack<S2Loop_*,_std::deque<S2Loop_*,_std::allocator<S2Loop_*>_>_>::stack
            ((stack<S2Loop_*,_std::deque<S2Loop_*,_std::allocator<S2Loop_*>_>_> *)local_68,&local_b8
            );
  std::deque<S2Loop_*,_std::allocator<S2Loop_*>_>::~deque(&local_b8);
  std::allocator<S2Loop_*>::~allocator(&local_d1);
  loop._0_4_ = -1;
  do {
    bVar1 = std::stack<S2Loop_*,_std::deque<S2Loop_*,_std::allocator<S2Loop_*>_>_>::empty
                      ((stack<S2Loop_*,_std::deque<S2Loop_*,_std::allocator<S2Loop_*>_>_> *)local_68
                      );
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::stack<S2Loop_*,_std::deque<S2Loop_*,_std::allocator<S2Loop_*>_>_>::~stack
                ((stack<S2Loop_*,_std::deque<S2Loop_*,_std::allocator<S2Loop_*>_>_> *)local_68);
      return;
    }
    ppSVar2 = std::stack<S2Loop_*,_std::deque<S2Loop_*,_std::allocator<S2Loop_*>_>_>::top
                        ((stack<S2Loop_*,_std::deque<S2Loop_*,_std::allocator<S2Loop_*>_>_> *)
                         local_68);
    children = (vector<S2Loop_*,_std::allocator<S2Loop_*>_> *)*ppSVar2;
    std::stack<S2Loop_*,_std::deque<S2Loop_*,_std::allocator<S2Loop_*>_>_>::pop
              ((stack<S2Loop_*,_std::deque<S2Loop_*,_std::allocator<S2Loop_*>_>_> *)local_68);
    if (children != (vector<S2Loop_*,_std::allocator<S2Loop_*>_> *)0x0) {
      loop._0_4_ = S2Loop::depth((S2Loop *)children);
      std::
      vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
      ::emplace_back<S2Loop*&>
                ((vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
                  *)&this->loops_,(S2Loop **)&children);
    }
    pmStack_f8 = std::
                 map<S2Loop_*,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>_>_>
                 ::operator[]((map<S2Loop_*,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>_>_>
                               *)loop_stack.c.super__Deque_base<S2Loop_*,_std::allocator<S2Loop_*>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_node,
                              (key_type *)&children);
    sVar3 = std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>::size(pmStack_f8);
    child._4_4_ = (int)sVar3;
    while (child._4_4_ = child._4_4_ + -1, -1 < child._4_4_) {
      ppSVar4 = std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>::operator[]
                          (pmStack_f8,(long)child._4_4_);
      local_108 = *ppSVar4;
      if (local_108 == (S2Loop *)0x0) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_120,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
                   ,0x128,kFatal,(ostream *)&std::cerr);
        poVar5 = S2LogMessage::stream(&local_120);
        poVar5 = std::operator<<(poVar5,"Check failed: child != nullptr ");
        S2LogMessageVoidify::operator&(&local_109,poVar5);
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_120);
      }
      S2Loop::set_depth(local_108,(int)loop + 1);
      std::stack<S2Loop_*,_std::deque<S2Loop_*,_std::allocator<S2Loop_*>_>_>::push
                ((stack<S2Loop_*,_std::deque<S2Loop_*,_std::allocator<S2Loop_*>_>_> *)local_68,
                 &local_108);
    }
  } while( true );
}

Assistant:

void S2Polygon::InitLoops(LoopMap* loop_map) {
  std::stack<S2Loop*> loop_stack({nullptr});
  int depth = -1;
  while (!loop_stack.empty()) {
    S2Loop* loop = loop_stack.top();
    loop_stack.pop();
    if (loop != nullptr) {
      depth = loop->depth();
      loops_.emplace_back(loop);
    }
    const vector<S2Loop*>& children = (*loop_map)[loop];
    for (int i = children.size() - 1; i >= 0; --i) {
      S2Loop* child = children[i];
      S2_DCHECK(child != nullptr);
      child->set_depth(depth + 1);
      loop_stack.push(child);
    }
  }
}